

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_Message(FParser *this)

{
  bool bVar1;
  char *in_RAX;
  AActor *pAVar2;
  FString local_18;
  
  if (0 < this->t_argc) {
    local_18.Chars = in_RAX;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
    if (pAVar2 != (AActor *)0x0) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
      bVar1 = AActor::CheckLocalView(pAVar2,consoleplayer);
      if (bVar1) {
        GetFormatString((FParser *)&stack0xffffffffffffffe8,(int)this);
        Printf(2,"%s\n",local_18.Chars);
        FString::~FString(&stack0xffffffffffffffe8);
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_Message(void)
{
	if (t_argc>0 && Script->trigger &&
		Script->trigger->CheckLocalView(consoleplayer))
	{
		Printf(PRINT_HIGH, "%s\n", GetFormatString(0).GetChars());
	}
}